

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O0

bool __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::find_atomic_impl_(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                    *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                   int *val)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  size_type sVar4;
  size_type sVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  HME local_90;
  ulong local_70;
  size_type slot;
  undefined1 auStack_60 [4];
  int status;
  HME entry;
  size_type sStack_38;
  bool success;
  size_type probe;
  size_t hash;
  int *val_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *this_local;
  
  sVar3 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this->field_0x18,key);
  sStack_38 = 0;
  entry.used._3_1_ = 0;
  HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  ::HashMapEntry((HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                  *)auStack_60);
  do {
    sVar4 = get_probe(this,sStack_38);
    sVar5 = capacity(this);
    local_70 = (sVar3 + sVar4) % sVar5;
    atomic_get_entry(&local_90,this,local_70);
    _auStack_60 = local_90.key.ptr.rank;
    entry.key.ptr.rank = local_90.key.ptr.ptr;
    entry.key.ptr.ptr = local_90.key.len;
    entry.key.len._0_4_ = local_90.val.val;
    entry.key.len._4_4_ = local_90.used;
    sVar1 = entry.key.len;
    entry.key.len._4_4_ = local_90.used;
    slot._4_4_ = entry.key.len._4_4_;
    entry.key.len = sVar1;
    if ((local_90._24_8_ & 0x200000000) != 0) {
      HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
      ::get_key(&local_b0,
                (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                 *)auStack_60);
      entry.used._3_1_ = std::operator==(&local_b0,key);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    bVar6 = false;
    if ((entry.used._3_1_ & 1) == 0) {
      sVar5 = capacity(this);
      bVar6 = sStack_38 + 1 < sVar5;
    }
    sStack_38 = sStack_38 + 1;
  } while (bVar6);
  bVar6 = (entry.used._3_1_ & 1) != 0;
  if (bVar6) {
    iVar2 = HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
            ::get_val((HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                       *)auStack_60);
    *val = iVar2;
  }
  return bVar6;
}

Assistant:

bool find_atomic_impl_(const Key &key, T &val) {
    size_t hash = hash_fn_(key);
    size_type probe = 0;
    bool success = false;
    HME entry;
    int status;
    do {
      size_type slot = (hash + get_probe(probe++)) % capacity();
      entry = atomic_get_entry(slot);
      status = entry.used;
      if (status & ready_flag) {
        success = (entry.get_key() == key);
      }
    } while (!success && !(status & free_flag) && probe < capacity());
    if (success) {
      val = entry.get_val();
      return true;
    } else {
      return false;
    }
  }